

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtility.cpp
# Opt level: O0

int __thiscall TestSuit::run(TestSuit *this)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pTVar4;
  long *in_RDI;
  exception *e;
  TestFunction *test;
  iterator __end1;
  iterator __begin1;
  vector<TestFunction,_std::allocator<TestFunction>_> *__range1;
  vector<TestFunction,_std::allocator<TestFunction>_> *in_stack_ffffffffffffff98;
  function<void_()> *in_stack_ffffffffffffffa0;
  __normal_iterator<TestFunction_*,_std::vector<TestFunction,_std::allocator<TestFunction>_>_>
  local_20;
  long *local_18;
  
  (**(code **)(*in_RDI + 0x10))();
  poVar2 = std::operator<<((ostream *)&std::cout,"Number of test cases: ");
  sVar3 = std::vector<TestFunction,_std::allocator<TestFunction>_>::size
                    ((vector<TestFunction,_std::allocator<TestFunction>_> *)(in_RDI + 1));
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_18 = in_RDI + 1;
  local_20._M_current =
       (TestFunction *)
       std::vector<TestFunction,_std::allocator<TestFunction>_>::begin(in_stack_ffffffffffffff98);
  std::vector<TestFunction,_std::allocator<TestFunction>_>::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<TestFunction_*,_std::vector<TestFunction,_std::allocator<TestFunction>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<TestFunction_*,_std::vector<TestFunction,_std::allocator<TestFunction>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    pTVar4 = __gnu_cxx::
             __normal_iterator<TestFunction_*,_std::vector<TestFunction,_std::allocator<TestFunction>_>_>
             ::operator*(&local_20);
    poVar2 = std::operator<<((ostream *)&std::cout,"Testing ");
    poVar2 = std::operator<<(poVar2,(string *)pTVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::function<void_()>::operator()(in_stack_ffffffffffffffa0);
    __gnu_cxx::
    __normal_iterator<TestFunction_*,_std::vector<TestFunction,_std::allocator<TestFunction>_>_>::
    operator++(&local_20);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"All tests passed.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int TestSuit::run()
{
    setup();
    std::cout << "Number of test cases: " << tests.size() << std::endl;

    for (auto& test : tests)
    {
        std::cout << "Testing " << test.name << std::endl;

        try
        {
            test.func();
        }
        catch (std::exception& e)
        {
            on_failed();
            std::cerr << "test failed." << std::endl;
            std::cerr << e.what() << std::endl;
            return -1;
        }
    }

    std::cout << "All tests passed." << std::endl;
    return 0;
}